

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall ON_Material::ToPhysicallyBased(ON_Material *this)

{
  bool bVar1;
  element_type *peVar2;
  double local_a0;
  undefined8 local_80;
  ON_Color *local_78;
  ON_Color *local_70;
  bool local_59;
  ON_4fColor local_40;
  byte local_2e;
  bool local_2d;
  bool bGlass;
  bool bMetal;
  shared_ptr<ON_PhysicallyBasedMaterial> pbr;
  ON_Material *this_local;
  
  pbr.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = IsPhysicallyBased(this);
  if (!bVar1) {
    std::make_shared<ON_PhysicallyBasedMaterial,ON_Material&>
              ((ON_Material *)&stack0xffffffffffffffe0);
    bVar1 = std::operator!=((shared_ptr<ON_PhysicallyBasedMaterial> *)&stack0xffffffffffffffe0,
                            (nullptr_t)0x0);
    ON_REMOVE_ASAP_AssertEx
              ((uint)bVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x2407,"","pbr != nullptr is false");
    local_59 = false;
    if ((this->m_transparency <= 0.01 && this->m_transparency != 0.01) &&
       (local_59 = false, (this->m_bFresnelReflections & 1U) == 0)) {
      local_59 = 0.99 < this->m_reflectivity;
    }
    local_2d = local_59;
    local_2e = 0.99 < this->m_transparency;
    peVar2 = std::
             __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
    if ((local_2d & 1U) == 0) {
      if ((local_2e & 1) == 0) {
        local_78 = &this->m_diffuse;
      }
      else {
        local_78 = &this->m_transparent;
      }
      local_70 = local_78;
    }
    else {
      local_70 = &this->m_reflection;
    }
    ON_4fColor::ON_4fColor(&local_40,local_70);
    (*peVar2->_vptr_ON_PhysicallyBasedMaterial[6])(peVar2,&local_40);
    peVar2 = std::
             __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
    local_80 = 0x3ff0000000000000;
    if ((local_2d & 1U) == 0) {
      local_80 = 0;
    }
    (*peVar2->_vptr_ON_PhysicallyBasedMaterial[0xe])(local_80);
    peVar2 = std::
             __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
    if ((local_2d & 1U) == 0) {
      local_a0 = 1.0 - this->m_reflectivity;
    }
    else {
      local_a0 = this->m_reflection_glossiness;
    }
    (*peVar2->_vptr_ON_PhysicallyBasedMaterial[0x16])(local_a0);
    peVar2 = std::
             __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
    (*peVar2->_vptr_ON_PhysicallyBasedMaterial[0x26])(1.0 - this->m_transparency);
    peVar2 = std::
             __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
    (*peVar2->_vptr_ON_PhysicallyBasedMaterial[0x24])(this->m_index_of_refraction);
    bVar1 = IsPhysicallyBased(this);
    ON_REMOVE_ASAP_AssertEx
              (bVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x2412,"","IsPhysicallyBased() is false");
    std::shared_ptr<ON_PhysicallyBasedMaterial>::~shared_ptr
              ((shared_ptr<ON_PhysicallyBasedMaterial> *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void ON_Material::ToPhysicallyBased(void)
{
  if (IsPhysicallyBased())
    return;

  //This should always be valid.
  auto pbr = std::make_shared<ON_PhysicallyBasedMaterial>(*this);
  ON_ASSERT(pbr != nullptr);

  const bool bMetal = m_transparency < 0.01 && !m_bFresnelReflections && m_reflectivity > 0.99;
  const bool bGlass = m_transparency > 0.99;

  pbr->SetBaseColor(bMetal ? m_reflection : bGlass ? m_transparent : m_diffuse);
  pbr->SetMetallic(bMetal ? 1.0 : 0.0);
  pbr->SetRoughness(bMetal ? m_reflection_glossiness : 1.0 - m_reflectivity);
  pbr->SetOpacity(1.0 - m_transparency);
  pbr->SetOpacityIOR(m_index_of_refraction);

  ON_ASSERT(IsPhysicallyBased());
}